

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::
add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>
::add_layer(add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>
            *this)

{
  add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
  *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  storage_heap sVar3;
  
  cpu::pooling::pooling((pooling *)this);
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->details).params.super_tensor.m_n = auVar2._0_8_;
  (this->details).params.super_tensor.m_k = auVar2._8_8_;
  (this->details).params.super_tensor.m_nr = auVar2._16_8_;
  (this->details).params.super_tensor.m_nc = auVar2._24_8_;
  (this->details).params.super_tensor.m_size = 0;
  (this->details).params.data_instance.data_size = 0;
  (this->details).params.super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->details).params.data_instance.host_current = true;
  (this->details).params.data_instance.device_current = true;
  (this->details).params.data_instance.have_active_transfer = false;
  (this->details).params.data_instance.device_in_use = false;
  (this->details).params.data_instance.data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->details).params.data_instance.data_device = (shared_ptr<float>)auVar2._16_16_;
  *(undefined1 (*) [32])
   ((long)&(this->details).params.data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ZEXT1632(auVar1);
  (this->details).params._annotation.storage = (storage_heap)ZEXT1632(auVar1);
  (this->details).padding_y_ = 0;
  (this->details).padding_x_ = 0;
  this_00 = (add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
             *)operator_new(0x760);
  add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>
  ::add_skip_layer(this_00);
  (this->subnetwork)._M_t.super___uniq_ptr_impl<_a8e22392_>._M_t.super__Tuple_impl<_e5336e65_>.
  super__Head_base<0UL,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_128,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::add_prev_<dlib::tag2>,_dlib::add_layer<dlib::avg_pool_<2L,_2L,_2,_2,_0,_0>,_dlib::add_skip_layer<dlib::tag1,_dlib::add_tag_layer<2UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_*,_false>
  ._M_head_impl = this_00;
  this->this_layer_setup_called = false;
  this->gradient_input_is_stale = true;
  this->get_output_and_gradient_input_disabled = false;
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->x_grad).super_tensor.m_n = auVar2._0_8_;
  (this->x_grad).super_tensor.m_k = auVar2._8_8_;
  (this->x_grad).super_tensor.m_nr = auVar2._16_8_;
  (this->x_grad).super_tensor.m_nc = auVar2._24_8_;
  (this->x_grad).super_tensor.m_size = 0;
  (this->x_grad).data_instance.data_size = 0;
  (this->x_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->x_grad).data_instance.host_current = true;
  (this->x_grad).data_instance.device_current = true;
  (this->x_grad).data_instance.have_active_transfer = false;
  (this->x_grad).data_instance.device_in_use = false;
  (this->x_grad).data_instance.data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->x_grad).data_instance.data_device = (shared_ptr<float>)auVar2._16_16_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->x_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->x_grad)._annotation.storage = sVar3;
  (this->cached_output).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->cached_output).super_tensor.m_k = (longlong)sVar3.del;
  (this->cached_output).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->cached_output).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->cached_output).super_tensor.m_size = 0;
  (this->cached_output).data_instance.data_size = 0;
  (this->cached_output).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->cached_output).data_instance.host_current = true;
  (this->cached_output).data_instance.device_current = true;
  (this->cached_output).data_instance.have_active_transfer = false;
  (this->cached_output).data_instance.device_in_use = false;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.ptr;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->cached_output).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->cached_output)._annotation.storage = sVar3;
  (this->params_grad).super_tensor.m_size = 0;
  (this->params_grad).data_instance.data_size = 0;
  (this->params_grad).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->params_grad).super_tensor.m_k = (longlong)sVar3.del;
  (this->params_grad).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->params_grad).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->params_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->params_grad).data_instance.host_current = true;
  (this->params_grad).data_instance.device_current = true;
  (this->params_grad).data_instance.have_active_transfer = false;
  (this->params_grad).data_instance.device_in_use = false;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(storage_heap *)
   ((long)&(this->params_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->params_grad)._annotation.storage = sVar3;
  (this->temp_tensor).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->temp_tensor).super_tensor.m_k = (longlong)sVar3.del;
  (this->temp_tensor).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->temp_tensor).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->temp_tensor).super_tensor.m_size = 0;
  (this->temp_tensor).data_instance.data_size = 0;
  (this->temp_tensor).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->temp_tensor).data_instance.host_current = true;
  (this->temp_tensor).data_instance.device_current = true;
  (this->temp_tensor).data_instance.have_active_transfer = false;
  (this->temp_tensor).data_instance.device_in_use = false;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(undefined1 (*) [32])
   ((long)&(this->temp_tensor).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ZEXT1632(auVar1);
  (this->temp_tensor)._annotation.storage = (storage_heap)ZEXT1632(auVar1);
  return;
}

Assistant:

add_layer(
        ):
            subnetwork(new subnet_type()),
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false)
        {
            if (this_layer_operates_inplace())
                subnetwork->disable_output_and_gradient_getters();
        }